

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O2

EigenAnswer *
OppositeRealValues(EigenAnswer *__return_storage_ptr__,Vector *x1,Vector *x2,Vector *x3)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  Vector ans;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  pdVar2 = (x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  dVar6 = 0.0;
  for (lVar5 = 0;
      (long)(x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    dVar1 = (x1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    if (((dVar1 != 0.0) || (dVar7 = dVar6, NAN(dVar1))) &&
       (dVar7 = pdVar2[lVar5] / dVar1, dVar7 <= dVar6)) {
      dVar7 = dVar6;
    }
    dVar6 = dVar7;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_38,x3);
  pdVar2 = (x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pdVar3 = (x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar4 = (x2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  for (lVar5 = 0; (long)pdVar2 - (long)pdVar3 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    local_38._M_impl.super__Vector_impl_data._M_start[lVar5] =
         pdVar4[lVar5] * dVar6 + local_38._M_impl.super__Vector_impl_data._M_start[lVar5];
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vector,(vector<double,_std::allocator<double>_> *)&local_38);
  __return_storage_ptr__->value = dVar6;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

EigenAnswer OppositeRealValues(const Vector &x1, const Vector &x2, const Vector &x3)
{
    double value = 0;
    // average?
    for (int i = 0; i < x3.size(); ++i)
    {
        if (x1[i] != 0)
        {
            value = std::max(value, x3[i] / x1[i]);
        }
    }

    value = std::sqrt(value);

    // second?
    Vector ans = x3;

    for (int i = 0; i < x3.size(); ++i)
    {
        ans[i] += value * x2[i];
    }

    return {.vector = ans, .value = value};
}